

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Base64.hh
# Opt level: O2

void __thiscall Pl_Base64::~Pl_Base64(Pl_Base64 *this)

{
  Pipeline::~Pipeline(&this->super_Pipeline);
  operator_delete(this,0x48);
  return;
}

Assistant:

~Pl_Base64() final = default;